

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineResourceSignatureBase.cpp
# Opt level: O0

size_t Diligent::CalculatePipelineResourceSignatureDescHash(PipelineResourceSignatureDesc *Desc)

{
  uint local_40;
  uint local_3c;
  uint local_38;
  Uint32 i_1;
  uint local_30;
  uint local_2c;
  long local_28;
  PipelineResourceDesc *Res;
  size_t sStack_18;
  Uint32 i;
  size_t Hash;
  PipelineResourceSignatureDesc *Desc_local;
  
  Hash = (size_t)Desc;
  sStack_18 = ComputeHash<unsigned_int,unsigned_int,unsigned_char>
                        (&Desc->NumResources,&Desc->NumImmutableSamplers,&Desc->BindingIndex);
  for (Res._4_4_ = 0; Res._4_4_ < *(uint *)(Hash + 0x10); Res._4_4_ = Res._4_4_ + 1) {
    local_28 = *(long *)(Hash + 8) + (ulong)Res._4_4_ * 0x18;
    local_2c = *(uint *)(local_28 + 8);
    local_30 = (uint)*(byte *)(local_28 + 0x10);
    i_1 = (Uint32)*(byte *)(local_28 + 0x11);
    local_38 = (uint)*(byte *)(local_28 + 0x12);
    HashCombine<unsigned_int,unsigned_int,unsigned_int,unsigned_int,unsigned_int>
              (&stack0xffffffffffffffe8,&local_2c,(uint *)(local_28 + 0xc),&local_30,&i_1,&local_38)
    ;
  }
  for (local_3c = 0; local_3c < *(uint *)(Hash + 0x20); local_3c = local_3c + 1) {
    local_40 = *(uint *)(*(long *)(Hash + 0x18) + (ulong)local_3c * 0x48);
    HashCombine<unsigned_int,Diligent::SamplerDesc>
              (&stack0xffffffffffffffe8,&local_40,
               (SamplerDesc *)(*(long *)(Hash + 0x18) + (ulong)local_3c * 0x48 + 0x10));
  }
  return sStack_18;
}

Assistant:

size_t CalculatePipelineResourceSignatureDescHash(const PipelineResourceSignatureDesc& Desc) noexcept
{
    size_t Hash = ComputeHash(Desc.NumResources, Desc.NumImmutableSamplers, Desc.BindingIndex);

    for (Uint32 i = 0; i < Desc.NumResources; ++i)
    {
        const PipelineResourceDesc& Res = Desc.Resources[i];
        HashCombine(Hash, Uint32{Res.ShaderStages}, Res.ArraySize, Uint32{Res.ResourceType}, Uint32{Res.VarType}, Uint32{Res.Flags});
    }

    for (Uint32 i = 0; i < Desc.NumImmutableSamplers; ++i)
    {
        HashCombine(Hash, Uint32{Desc.ImmutableSamplers[i].ShaderStages}, Desc.ImmutableSamplers[i].Desc);
    }

    return Hash;
}